

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O0

void Assimp::FBX::ResolveVertexDataArray<aiVector3t<float>>
               (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *data_out,
               Scope *source,string *MappingInformationType,string *ReferenceInformationType,
               char *dataElementName,char *indexDataElementName,size_t vertex_count,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *mapping_counts,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *mapping_offsets,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *mappings)

{
  value_type vVar1;
  value_type vVar2;
  int iVar3;
  float fVar4;
  char *pcVar5;
  string *psVar6;
  Scope *pSVar7;
  bool bVar8;
  const_reference pvVar9;
  reference pvVar10;
  Element *pEVar11;
  size_type sVar12;
  reference piVar13;
  reference pvVar14;
  ulong uVar15;
  reference pvVar16;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar17;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar18;
  byte local_631;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_630;
  allocator local_4b1;
  string local_4b0;
  allocator local_489;
  string local_488;
  int local_464;
  iterator iStack_460;
  int i_2;
  iterator __end6;
  iterator __begin6;
  vector<int,_std::allocator<int>_> *__range6;
  undefined1 auStack_440 [4];
  uint next;
  aiVector3t<float> empty;
  undefined1 local_410 [8];
  vector<int,_std::allocator<int>_> uvIndices_1;
  string local_3f0;
  undefined1 local_3d0 [8];
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tempData_3;
  size_type local_3b0;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  allocator local_229;
  string local_228;
  undefined1 local_208 [8];
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tempData_2;
  string local_1e8;
  allocator local_1c1;
  string local_1c0;
  uint local_19c;
  uint local_198;
  uint j_1;
  uint iend_1;
  uint istart_1;
  size_t e_1;
  size_t i_1;
  string local_178;
  undefined1 local_158 [8];
  vector<int,_std::allocator<int>_> uvIndices;
  string local_138;
  undefined1 local_118 [8];
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tempData_1;
  uint j;
  uint iend;
  uint istart;
  size_t e;
  size_t i;
  string local_d8;
  undefined1 local_b8 [8];
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tempData;
  string local_98;
  byte local_75;
  byte local_62;
  allocator local_61;
  string local_60;
  byte local_3a;
  byte local_39;
  bool isIndexToDirect;
  char *pcStack_38;
  bool isDirect;
  char *indexDataElementName_local;
  char *dataElementName_local;
  string *ReferenceInformationType_local;
  string *MappingInformationType_local;
  Scope *source_local;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *data_out_local;
  
  pcStack_38 = indexDataElementName;
  indexDataElementName_local = dataElementName;
  dataElementName_local = (char *)ReferenceInformationType;
  ReferenceInformationType_local = MappingInformationType;
  MappingInformationType_local = (string *)source;
  source_local = (Scope *)data_out;
  local_39 = std::operator==(ReferenceInformationType,"Direct");
  local_3a = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             dataElementName_local,"IndexToDirect");
  psVar6 = MappingInformationType_local;
  pcVar5 = pcStack_38;
  local_62 = 0;
  local_75 = 0;
  local_631 = 0;
  if ((bool)local_3a) {
    std::allocator<char>::allocator();
    local_62 = 1;
    std::__cxx11::string::string((string *)&local_60,pcVar5,&local_61);
    local_75 = 1;
    bVar8 = HasElement((Scope *)psVar6,&local_60);
    local_631 = bVar8 ^ 0xff;
  }
  if ((local_75 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_60);
  }
  if ((local_62 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
  }
  if ((local_631 & 1) != 0) {
    local_39 = 1;
    local_3a = 0;
  }
  bVar8 = std::operator==(ReferenceInformationType_local,"ByVertice");
  psVar6 = MappingInformationType_local;
  pcVar5 = indexDataElementName_local;
  if ((bVar8) && ((local_39 & 1) != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_98,pcVar5,
               (allocator *)
               ((long)&tempData.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    bVar8 = HasElement((Scope *)psVar6,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&tempData.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    if (((bVar8 ^ 0xffU) & 1) == 0) {
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
                ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_b8);
      psVar6 = MappingInformationType_local;
      pcVar5 = indexDataElementName_local;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_d8,pcVar5,(allocator *)((long)&i + 7));
      pEVar11 = GetRequiredElement((Scope *)psVar6,&local_d8,(Element *)0x0);
      ParseVectorDataArray
                ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_b8,pEVar11)
      ;
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)source_local,
                 vertex_count);
      e = 0;
      sVar12 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                         ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_b8
                         );
      for (; e < sVar12; e = e + 1) {
        pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (mapping_offsets,e);
        vVar2 = *pvVar9;
        pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (mapping_counts,e);
        vVar1 = *pvVar9;
        for (tempData_1.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = vVar2;
            tempData_1.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < vVar2 + vVar1;
            tempData_1.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                 tempData_1.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
          pvVar14 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                               local_b8,e);
          pSVar7 = source_local;
          pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (mappings,(ulong)tempData_1.
                                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                              _4_4_);
          pvVar16 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                               pSVar7,(ulong)*pvVar9);
          fVar4 = pvVar14->y;
          pvVar16->x = pvVar14->x;
          pvVar16->y = fVar4;
          pvVar16->z = pvVar14->z;
        }
      }
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
                ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_b8);
    }
  }
  else {
    bVar8 = std::operator==(ReferenceInformationType_local,"ByVertice");
    if ((bVar8) && ((local_3a & 1) != 0)) {
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
                ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_118);
      psVar6 = MappingInformationType_local;
      pcVar5 = indexDataElementName_local;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_138,pcVar5,
                 (allocator *)
                 ((long)&uvIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      pEVar11 = GetRequiredElement((Scope *)psVar6,&local_138,(Element *)0x0);
      ParseVectorDataArray
                ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_118,pEVar11
                );
      std::__cxx11::string::~string((string *)&local_138);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&uvIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)source_local,
                 vertex_count);
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_158)
      ;
      psVar6 = MappingInformationType_local;
      pcVar5 = pcStack_38;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_178,pcVar5,(allocator *)((long)&i_1 + 7));
      pEVar11 = GetRequiredElement((Scope *)psVar6,&local_178,(Element *)0x0);
      ParseVectorDataArray((vector<int,_std::allocator<int>_> *)local_158,pEVar11);
      std::__cxx11::string::~string((string *)&local_178);
      std::allocator<char>::~allocator((allocator<char> *)((long)&i_1 + 7));
      e_1 = 0;
      _iend_1 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)local_158);
      for (; e_1 < _iend_1; e_1 = e_1 + 1) {
        pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (mapping_offsets,e_1);
        vVar2 = *pvVar9;
        j_1 = vVar2;
        pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (mapping_counts,e_1);
        local_198 = vVar2 + *pvVar9;
        for (local_19c = j_1; local_19c < local_198; local_19c = local_19c + 1) {
          pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)local_158,e_1);
          iVar3 = *pvVar10;
          sVar12 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                             ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                              local_118);
          if (sVar12 <= (ulong)(long)iVar3) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_1c0,"index out of range",&local_1c1);
            psVar6 = MappingInformationType_local;
            pcVar5 = pcStack_38;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_1e8,pcVar5,
                       (allocator *)
                       ((long)&tempData_2.
                               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            pEVar11 = GetRequiredElement((Scope *)psVar6,&local_1e8,(Element *)0x0);
            Util::DOMError(&local_1c0,pEVar11);
          }
          pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)local_158,e_1);
          pvVar14 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                               local_118,(long)*pvVar10);
          pSVar7 = source_local;
          pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (mappings,(ulong)local_19c);
          pvVar16 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                               pSVar7,(ulong)*pvVar9);
          fVar4 = pvVar14->y;
          pvVar16->x = pvVar14->x;
          pvVar16->y = fVar4;
          pvVar16->z = pvVar14->z;
        }
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_158);
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
                ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_118);
    }
    else {
      bVar8 = std::operator==(ReferenceInformationType_local,"ByPolygonVertex");
      if ((bVar8) && ((local_39 & 1) != 0)) {
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_208);
        psVar6 = MappingInformationType_local;
        pcVar5 = indexDataElementName_local;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_228,pcVar5,&local_229);
        pEVar11 = GetRequiredElement((Scope *)psVar6,&local_228,(Element *)0x0);
        ParseVectorDataArray
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_208,
                   pEVar11);
        std::__cxx11::string::~string((string *)&local_228);
        std::allocator<char>::~allocator((allocator<char> *)&local_229);
        sVar12 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                           ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                            local_208);
        bVar8 = sVar12 == vertex_count;
        if (bVar8) {
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::swap
                    ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)source_local,
                     (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_208);
        }
        else {
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[56]>
                    (&local_3a8,
                     (char (*) [56])"length of input data unexpected for ByPolygon mapping: ");
          local_3b0 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                                ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                                 local_208);
          pbVar17 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                    operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                               &local_3a8,&local_3b0);
          pbVar17 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                    operator<<(pbVar17,(char (*) [12])", expected ");
          pbVar18 = Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                    operator<<(pbVar17,&vertex_count);
          LogFunctions<Assimp::FBXImporter>::LogError(pbVar18);
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          ~basic_formatter(&local_3a8);
        }
        tempData_3.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
        tempData_3.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar8;
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_208);
      }
      else {
        bVar8 = std::operator==(ReferenceInformationType_local,"ByPolygonVertex");
        if ((bVar8) && ((local_3a & 1) != 0)) {
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
                    ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_3d0);
          psVar6 = MappingInformationType_local;
          pcVar5 = indexDataElementName_local;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_3f0,pcVar5,
                     (allocator *)
                     ((long)&uvIndices_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 7));
          pEVar11 = GetRequiredElement((Scope *)psVar6,&local_3f0,(Element *)0x0);
          ParseVectorDataArray
                    ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_3d0,
                     pEVar11);
          std::__cxx11::string::~string((string *)&local_3f0);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&uvIndices_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 7));
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                    ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)source_local,
                     vertex_count);
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)local_410);
          psVar6 = MappingInformationType_local;
          pcVar5 = pcStack_38;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&empty.z,pcVar5,(allocator *)((long)&empty.y + 3));
          pEVar11 = GetRequiredElement((Scope *)psVar6,(string *)&empty.z,(Element *)0x0);
          ParseVectorDataArray((vector<int,_std::allocator<int>_> *)local_410,pEVar11);
          std::__cxx11::string::~string((string *)&empty.z);
          std::allocator<char>::~allocator((allocator<char> *)((long)&empty.y + 3));
          sVar12 = std::vector<int,_std::allocator<int>_>::size
                             ((vector<int,_std::allocator<int>_> *)local_410);
          if (sVar12 == vertex_count) {
            aiVector3t<float>::aiVector3t((aiVector3t<float> *)auStack_440);
            __range6._4_4_ = 0;
            __end6 = std::vector<int,_std::allocator<int>_>::begin
                               ((vector<int,_std::allocator<int>_> *)local_410);
            iStack_460 = std::vector<int,_std::allocator<int>_>::end
                                   ((vector<int,_std::allocator<int>_> *)local_410);
            while (bVar8 = __gnu_cxx::operator!=(&__end6,&stack0xfffffffffffffba0), bVar8) {
              piVar13 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator*(&__end6);
              local_464 = *piVar13;
              if (local_464 == -1) {
                pvVar14 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::
                          operator[]((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                      *)source_local,(ulong)__range6._4_4_);
                pvVar14->x = (float)auStack_440;
                pvVar14->y = (float)next;
                pvVar14->z = empty.x;
              }
              else {
                uVar15 = (ulong)local_464;
                sVar12 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                                   ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                     *)local_3d0);
                if (sVar12 <= uVar15) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)&local_488,"index out of range",&local_489)
                  ;
                  psVar6 = MappingInformationType_local;
                  pcVar5 = pcStack_38;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)&local_4b0,pcVar5,&local_4b1);
                  pEVar11 = GetRequiredElement((Scope *)psVar6,&local_4b0,(Element *)0x0);
                  Util::DOMError(&local_488,pEVar11);
                }
                pvVar14 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::
                          operator[]((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                      *)local_3d0,(long)local_464);
                pvVar16 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::
                          operator[]((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                      *)source_local,(ulong)__range6._4_4_);
                fVar4 = pvVar14->y;
                pvVar16->x = pvVar14->x;
                pvVar16->y = fVar4;
                pvVar16->z = pvVar14->z;
              }
              __range6._4_4_ = __range6._4_4_ + 1;
              __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator++(&__end6);
            }
            tempData_3.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          }
          else {
            LogFunctions<Assimp::FBXImporter>::LogError
                      ("length of input data unexpected for ByPolygonVertex mapping");
            tempData_3.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
          }
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)local_410);
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
                    ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_3d0);
        }
        else {
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[60]>
                    (&local_630,
                     (char (*) [60])"ignoring vertex data channel, access type not implemented: ");
          pbVar17 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                    operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                               &local_630,ReferenceInformationType_local);
          pbVar17 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                    operator<<(pbVar17,(char (*) [2])0x2fb035);
          pbVar18 = Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                    operator<<(pbVar17,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)dataElementName_local);
          LogFunctions<Assimp::FBXImporter>::LogError(pbVar18);
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          ~basic_formatter(&local_630);
        }
      }
    }
  }
  return;
}

Assistant:

void ResolveVertexDataArray(std::vector<T>& data_out, const Scope& source,
    const std::string& MappingInformationType,
    const std::string& ReferenceInformationType,
    const char* dataElementName,
    const char* indexDataElementName,
    size_t vertex_count,
    const std::vector<unsigned int>& mapping_counts,
    const std::vector<unsigned int>& mapping_offsets,
    const std::vector<unsigned int>& mappings)
{
    bool isDirect = ReferenceInformationType == "Direct";
    bool isIndexToDirect = ReferenceInformationType == "IndexToDirect";

    // fall-back to direct data if there is no index data element
    if ( isIndexToDirect && !HasElement( source, indexDataElementName ) ) {
        isDirect = true;
        isIndexToDirect = false;
    }

    // handle permutations of Mapping and Reference type - it would be nice to
    // deal with this more elegantly and with less redundancy, but right
    // now it seems unavoidable.
    if (MappingInformationType == "ByVertice" && isDirect) {
        if (!HasElement(source, dataElementName)) {
            return;
        }
        std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

        data_out.resize(vertex_count);
		for (size_t i = 0, e = tempData.size(); i < e; ++i) {

            const unsigned int istart = mapping_offsets[i], iend = istart + mapping_counts[i];
            for (unsigned int j = istart; j < iend; ++j) {
				data_out[mappings[j]] = tempData[i];
            }
        }
    }
    else if (MappingInformationType == "ByVertice" && isIndexToDirect) {
		std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

        data_out.resize(vertex_count);

        std::vector<int> uvIndices;
        ParseVectorDataArray(uvIndices,GetRequiredElement(source,indexDataElementName));
        for (size_t i = 0, e = uvIndices.size(); i < e; ++i) {

            const unsigned int istart = mapping_offsets[i], iend = istart + mapping_counts[i];
            for (unsigned int j = istart; j < iend; ++j) {
				if (static_cast<size_t>(uvIndices[i]) >= tempData.size()) {
                    DOMError("index out of range",&GetRequiredElement(source,indexDataElementName));
                }
				data_out[mappings[j]] = tempData[uvIndices[i]];
            }
        }
    }
    else if (MappingInformationType == "ByPolygonVertex" && isDirect) {
		std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

		if (tempData.size() != vertex_count) {
            FBXImporter::LogError(Formatter::format("length of input data unexpected for ByPolygon mapping: ")
				<< tempData.size() << ", expected " << vertex_count
            );
            return;
        }

		data_out.swap(tempData);
    }
    else if (MappingInformationType == "ByPolygonVertex" && isIndexToDirect) {
		std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

        data_out.resize(vertex_count);

        std::vector<int> uvIndices;
        ParseVectorDataArray(uvIndices,GetRequiredElement(source,indexDataElementName));

        if (uvIndices.size() != vertex_count) {
            FBXImporter::LogError("length of input data unexpected for ByPolygonVertex mapping");
            return;
        }

        const T empty;
        unsigned int next = 0;
        for(int i : uvIndices) {
            if ( -1 == i ) {
                data_out[ next++ ] = empty;
                continue;
            }
            if (static_cast<size_t>(i) >= tempData.size()) {
                DOMError("index out of range",&GetRequiredElement(source,indexDataElementName));
            }

			data_out[next++] = tempData[i];
        }
    }
    else {
        FBXImporter::LogError(Formatter::format("ignoring vertex data channel, access type not implemented: ")
            << MappingInformationType << "," << ReferenceInformationType);
    }
}